

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Expression cnn::expr::sum_batches(Expression *x)

{
  undefined8 extraout_RDX;
  initializer_list<cnn::VariableIndex> *in_RSI;
  ComputationGraph *in_RDI;
  Expression EVar1;
  VariableIndex *i;
  ComputationGraph *pg;
  Expression *this;
  VariableIndex local_2c;
  VariableIndex *local_28;
  undefined8 local_20;
  ComputationGraph *this_00;
  
  this = (Expression *)in_RSI->_M_array;
  i = in_RSI->_M_array;
  pg = in_RDI;
  this_00 = in_RDI;
  VariableIndex::VariableIndex(&local_2c,(VariableIndex *)&in_RSI->_M_len);
  local_28 = &local_2c;
  local_20 = 1;
  ComputationGraph::add_function<cnn::SumBatches>(this_00,in_RSI);
  Expression::Expression(this,pg,i);
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = in_RDI;
  return EVar1;
}

Assistant:

Expression sum_batches(const Expression& x) { return Expression(x.pg, x.pg->add_function<SumBatches>({x.i})); }